

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QGraphicsItem::setAcceptedMouseButtons(QGraphicsItem *this,MouseButtons buttons)

{
  QGraphicsItem *pQVar1;
  QGraphicsItemPrivate *pQVar2;
  
  pQVar2 = (this->d_ptr).d;
  if ((QFlagsStorageHelper<Qt::MouseButton,_4>)(*(uint *)&pQVar2->field_0x160 & 0x1f) !=
      (QFlagsStorage<Qt::MouseButton>)
      buttons.super_QFlagsStorageHelper<Qt::MouseButton,_4>.super_QFlagsStorage<Qt::MouseButton>.i)
  {
    if (((QFlagsStorage<Qt::MouseButton>)
         buttons.super_QFlagsStorageHelper<Qt::MouseButton,_4>.super_QFlagsStorage<Qt::MouseButton>.
         i == (QFlagsStorage<Qt::MouseButton>)0x0) &&
       ((QGraphicsScene *)pQVar2->scene != (QGraphicsScene *)0x0)) {
      pQVar1 = QGraphicsScene::mouseGrabberItem((QGraphicsScene *)pQVar2->scene);
      pQVar2 = (this->d_ptr).d;
      if ((pQVar1 == this) && ((*(byte *)(*(long *)&pQVar2->scene->field_0x8 + 0xb9) & 8) != 0)) {
        ungrabMouse(this);
        pQVar2 = (this->d_ptr).d;
      }
    }
    *(ulong *)&pQVar2->field_0x160 =
         *(ulong *)&pQVar2->field_0x160 & 0xffffffffffffffe0 |
         (ulong)((uint)buttons.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                       super_QFlagsStorage<Qt::MouseButton>.i & 0x1f);
  }
  return;
}

Assistant:

T *operator->() const noexcept
    {
        return d;
    }